

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O0

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>
          (LAKBO *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t0,
          MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t1)

{
  Result RVar1;
  anon_class_1_0_00000001 iterFlat;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>
  *iter;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_fffffffffffffe30;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe38;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  *in_stack_fffffffffffffe70;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  *in_stack_fffffffffffffe78;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>_>
  *in_stack_ffffffffffffff50;
  anon_class_8_1_8991fb9c_for__func in_stack_ffffffffffffff58;
  
  iter = (IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>
          *)&stack0xffffffffffffffe7;
  cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
  operator()(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
  operator()(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(auto:1&)#1},Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(auto:1&)#1}::TEMPNAMEPLACEHOLDERVALUE(Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(auto:1)#1},Kernel::PolyNf_const&>>>>>
  ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(auto:1&)#1},Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel:...l::PolyNf_const&>>>>>)::{lambda(Kernel::PolyNf_const&)#1},std::pair<Kernel::PolyNf,Kernel::PolyNf>>>
  ::
  map<Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::_lambda(auto:1)_1_>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  RVar1 = AlascaOrderingUtils::
          lexIter<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>_>
                    (iter);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:101:16),_Kernel::Ordering::Result>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>
                 *)0x8e6b63);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>_>
  ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>_>
                 *)0x8e6b70);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
                 *)0x8e6b7a);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
                 *)0x8e6b84);
  return RVar1;
}

Assistant:

Ordering::Result cmpSameSkeleton(MonomFactors<NumTraits> const& t0, MonomFactors<NumTraits> const& t1) const 
  { 
    auto iterFlat = [](MonomFactors<NumTraits> const& m) {
      return m.iter()
        .flatMap([](auto& x) { return 
            range(0, x.power)
              .map([&](auto) -> auto& { return x.term; }); });
    };
    return AlascaOrderingUtils::lexIter(
        iterFlat(t0).zip(iterFlat(t1))
          .map([&](auto pair) { return cmpSameSkeleton(pair.first, pair.second); })
        );
  }